

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_binary_packed_decoder.cpp
# Opt level: O0

void __thiscall duckdb::DeltaBinaryPackedDecoder::InitializePage(DeltaBinaryPackedDecoder *this)

{
  unsigned_long *args_1;
  ResizeableBuffer *this_00;
  uchar **in_RDI;
  shared_ptr<duckdb::ResizeableBuffer,_true> *block;
  unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>
  *in_stack_ffffffffffffffc8;
  shared_ptr<duckdb::ResizeableBuffer,_true> *in_stack_ffffffffffffffd0;
  
  args_1 = (unsigned_long *)(*in_RDI + 0x50);
  this_00 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(in_stack_ffffffffffffffd0);
  shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
            ((shared_ptr<duckdb::ResizeableBuffer,_true> *)this_00);
  make_uniq<duckdb::DbpDecoder,unsigned_char*&,unsigned_long&>(in_RDI,args_1);
  unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::operator=
            ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true> *)
             this_00,in_stack_ffffffffffffffc8);
  unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::~unique_ptr
            ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true> *)
             0x23f945b);
  shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
            ((shared_ptr<duckdb::ResizeableBuffer,_true> *)this_00);
  shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
            ((shared_ptr<duckdb::ResizeableBuffer,_true> *)this_00);
  ByteBuffer::inc(&this_00->super_ByteBuffer,(uint64_t)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void DeltaBinaryPackedDecoder::InitializePage() {
	auto &block = reader.block;
	dbp_decoder = make_uniq<DbpDecoder>(block->ptr, block->len);
	block->inc(block->len);
}